

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutSopBalanceEvalInt
              (Vec_Int_t *vCover,int *pTimes,int *pFaninLits,Vec_Int_t *vAig,int *piRes,int nSuppAll
              ,int *pArea)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int in_stack_fffffffffffffce0;
  int nSuppAll_00;
  int nCounterAnd;
  int nCounterOr;
  int local_30c;
  int *local_308;
  int *local_300;
  int *local_2f8;
  Vec_Int_t *local_2f0;
  int pFaninLitsAnd [15];
  int pCounterAnd [15];
  int pFaninLitsOr [70];
  int pCounterOr [70];
  
  iVar3 = vCover->nSize;
  if (iVar3 < 0x47) {
    nCounterOr = 0;
    iVar6 = 0;
    iVar8 = 0;
    if (0 < nSuppAll) {
      iVar8 = nSuppAll;
    }
    iVar5 = 0;
    local_308 = pFaninLits;
    local_300 = pTimes;
    local_2f8 = piRes;
    local_2f0 = vCover;
    nSuppAll_00 = nSuppAll;
    while (pVVar2 = local_2f0, piVar1 = local_2f8, iVar6 < iVar3) {
      local_30c = iVar6;
      iVar3 = Vec_IntEntry(local_2f0,iVar6);
      nCounterAnd = 0;
      iVar6 = 0;
      nSuppAll_00 = nSuppAll;
      for (uVar7 = 0; (uint)(iVar8 * 2) != uVar7; uVar7 = uVar7 + 2) {
        switch(iVar3 >> ((byte)uVar7 & 0x1f) & 3) {
        case 0:
          goto switchD_0037ee92_caseD_0;
        case 1:
          iVar5 = *(int *)((long)local_300 + uVar7 * 2);
          piRes = (int *)0xffffffffffffffff;
          if (vAig != (Vec_Int_t *)0x0) {
            uVar4 = Abc_LitNot(*(int *)((long)local_308 + uVar7 * 2));
            piRes = (int *)(ulong)uVar4;
          }
          break;
        case 2:
          piRes = (int *)0xffffffffffffffff;
          if (vAig != (Vec_Int_t *)0x0) {
            piRes = (int *)(ulong)*(uint *)((long)local_308 + uVar7 * 2);
          }
          iVar5 = *(int *)((long)local_300 + uVar7 * 2);
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0xd3,
                        "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                       );
        }
        iVar6 = iVar6 + 1;
        iVar5 = If_LogCounterAddAig(pCounterAnd,&nCounterAnd,pFaninLitsAnd,iVar5,(int)piRes,vAig,
                                    nSuppAll_00,in_stack_fffffffffffffce0,nSuppAll_00);
switchD_0037ee92_caseD_0:
      }
      if (nCounterAnd < 1) {
        __assert_fail("nCounterAnd > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0xd5,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      if (iVar6 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0xd6,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      nSuppAll = nSuppAll_00;
      if (vAig == (Vec_Int_t *)0x0) {
        *pArea = *pArea + iVar6 + -1;
        piRes = (int *)0xffffffffffffffff;
      }
      else {
        iVar3 = If_LogCreateAndXorMulti(vAig,pFaninLitsAnd,nCounterAnd,nSuppAll_00,(int)piRes);
        uVar4 = Abc_LitNot(iVar3);
        piRes = (int *)(ulong)uVar4;
      }
      iVar5 = If_LogCounterAddAig(pCounterOr,&nCounterOr,pFaninLitsOr,iVar5,(int)piRes,vAig,
                                  nSuppAll_00,in_stack_fffffffffffffce0,nSuppAll);
      iVar3 = local_2f0->nSize;
      iVar6 = local_30c + 1;
    }
    if (nCounterOr < 1) {
      __assert_fail("nCounterOr > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xdd,
                    "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                   );
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = iVar3 + *pArea + -1;
    }
    else {
      iVar3 = If_LogCreateAndXorMulti(vAig,pFaninLitsOr,nCounterOr,nSuppAll_00,(int)piRes);
      iVar3 = Abc_LitNot(iVar3);
      *piVar1 = iVar3;
      if ((pVVar2->nCap & 0x10000) != 0) {
        iVar3 = Abc_LitNot(iVar3);
        *piVar1 = iVar3;
      }
    }
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int If_CutSopBalanceEvalInt( Vec_Int_t * vCover, int * pTimes, int * pFaninLits, Vec_Int_t * vAig, int * piRes, int nSuppAll, int * pArea )
{
    int nCounterAnd, pCounterAnd[IF_MAX_FUNC_LUTSIZE], pFaninLitsAnd[IF_MAX_FUNC_LUTSIZE];
    int nCounterOr,  pCounterOr[IF_MAX_CUBES],  pFaninLitsOr[IF_MAX_CUBES];
    int i, k, Entry, Literal, nLits, Delay = 0, iRes = 0;
    if ( Vec_IntSize(vCover) > IF_MAX_CUBES )
        return -1;
    nCounterOr = 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        nCounterAnd = nLits = 0;
        for ( k = 0; k < nSuppAll; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? Abc_LitNot(pFaninLits[k]) : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal == 2 ) // pos literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? pFaninLits[k] : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal != 0 ) 
                assert( 0 );
        }
        assert( nCounterAnd > 0 );
        assert( nLits > 0 );
        if ( vAig )
            iRes = If_LogCreateAndXorMulti( vAig, pFaninLitsAnd, nCounterAnd, nSuppAll, 0 );
        else
            *pArea += nLits == 1 ? 0 : nLits - 1;
        Delay = If_LogCounterAddAig( pCounterOr, &nCounterOr, pFaninLitsOr, Delay, vAig ? Abc_LitNot(iRes) : -1, vAig, nSuppAll, 0, 0 );
    }
    assert( nCounterOr > 0 );
    if ( vAig )
    {
        *piRes = Abc_LitNot( If_LogCreateAndXorMulti( vAig, pFaninLitsOr, nCounterOr, nSuppAll, 0 ) );
        if ( ((vCover->nCap >> 16) & 1) )  // hack to remember complemented attribute
            *piRes = Abc_LitNot( *piRes );
    }
    else       
        *pArea += Vec_IntSize(vCover) == 1 ? 0 : Vec_IntSize(vCover) - 1;
    return Delay;
}